

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveEXRToMemory(float *data,int width,int height,int components,int save_as_fp16,uchar **outbuf,
                   char **err)

{
  char *pcVar1;
  value_type vVar2;
  int iVar3;
  ostream *poVar4;
  float *__dest;
  reference pvVar5;
  size_t sVar6;
  pointer *local_508;
  vector<float,_std::allocator<float>_> *local_470;
  size_t mem_size;
  uchar *mem_buf;
  reference pvStack_438;
  int i_2;
  float *image_ptr [4];
  size_t i_1;
  size_t i;
  vector<float,_std::allocator<float>_> images [4];
  undefined1 local_3a0 [8];
  EXRImage image;
  EXRHeader header;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  uchar **local_30;
  uchar **outbuf_local;
  int save_as_fp16_local;
  int components_local;
  int height_local;
  int width_local;
  float *data_local;
  
  local_30 = outbuf;
  outbuf_local._0_4_ = save_as_fp16;
  outbuf_local._4_4_ = components;
  save_as_fp16_local = height;
  components_local = width;
  _height_local = data;
  if (((components == 1) || (components == 3)) || (components == 4)) {
    InitEXRHeader((EXRHeader *)&image.num_channels);
    if ((components_local < 0x10) && (save_as_fp16_local < 0x10)) {
      header.pixel_types._4_4_ = 0;
    }
    else {
      header.pixel_types._4_4_ = 3;
    }
    InitEXRImage((EXRImage *)local_3a0);
    image.width = outbuf_local._4_4_;
    local_470 = (vector<float,_std::allocator<float>_> *)&i;
    do {
      std::vector<float,_std::allocator<float>_>::vector(local_470);
      local_470 = local_470 + 1;
    } while (local_470 !=
             (vector<float,_std::allocator<float>_> *)
             &images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    if (outbuf_local._4_4_ == 1) {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)&i,
                 (long)(components_local * save_as_fp16_local));
      __dest = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)&i);
      memcpy(__dest,_height_local,(long)(components_local * save_as_fp16_local) << 2);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)&i,
                 (long)(components_local * save_as_fp16_local));
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 &images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (long)(components_local * save_as_fp16_local));
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 &images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (long)(components_local * save_as_fp16_local));
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 &images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (long)(components_local * save_as_fp16_local));
      if (outbuf_local._4_4_ == 4) {
        for (i_1 = 0; i_1 < (ulong)(long)(components_local * save_as_fp16_local); i_1 = i_1 + 1) {
          vVar2 = _height_local[(long)outbuf_local._4_4_ * i_1];
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)&i,i_1);
          *pvVar5 = vVar2;
          vVar2 = _height_local[(long)outbuf_local._4_4_ * i_1 + 1];
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)
                              &images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,i_1);
          *pvVar5 = vVar2;
          vVar2 = _height_local[(long)outbuf_local._4_4_ * i_1 + 2];
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)
                              &images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,i_1);
          *pvVar5 = vVar2;
          vVar2 = _height_local[(long)outbuf_local._4_4_ * i_1 + 3];
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)
                              &images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,i_1);
          *pvVar5 = vVar2;
        }
      }
      else {
        for (image_ptr[3] = (float *)0x0;
            image_ptr[3] < (float *)(long)(components_local * save_as_fp16_local);
            image_ptr[3] = (float *)((long)image_ptr[3] + 1)) {
          vVar2 = _height_local[(long)outbuf_local._4_4_ * (long)image_ptr[3]];
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)&i,(size_type)image_ptr[3]);
          *pvVar5 = vVar2;
          vVar2 = _height_local[(long)outbuf_local._4_4_ * (long)image_ptr[3] + 1];
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)
                              &images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(size_type)image_ptr[3]);
          *pvVar5 = vVar2;
          vVar2 = _height_local[(long)outbuf_local._4_4_ * (long)image_ptr[3] + 2];
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)
                              &images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(size_type)image_ptr[3]);
          *pvVar5 = vVar2;
        }
      }
    }
    memset(&stack0xfffffffffffffbc8,0,0x20);
    if (outbuf_local._4_4_ == 4) {
      pvStack_438 = std::vector<float,_std::allocator<float>_>::at
                              ((vector<float,_std::allocator<float>_> *)
                               &images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,0);
      image_ptr[0] = std::vector<float,_std::allocator<float>_>::at
                               ((vector<float,_std::allocator<float>_> *)
                                &images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,0);
      image_ptr[1] = std::vector<float,_std::allocator<float>_>::at
                               ((vector<float,_std::allocator<float>_> *)
                                &images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,0);
      image_ptr[2] = std::vector<float,_std::allocator<float>_>::at
                               ((vector<float,_std::allocator<float>_> *)&i,0);
    }
    else if (outbuf_local._4_4_ == 3) {
      pvStack_438 = std::vector<float,_std::allocator<float>_>::at
                              ((vector<float,_std::allocator<float>_> *)
                               &images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,0);
      image_ptr[0] = std::vector<float,_std::allocator<float>_>::at
                               ((vector<float,_std::allocator<float>_> *)
                                &images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,0);
      image_ptr[1] = std::vector<float,_std::allocator<float>_>::at
                               ((vector<float,_std::allocator<float>_> *)&i,0);
    }
    else if (outbuf_local._4_4_ == 1) {
      pvStack_438 = std::vector<float,_std::allocator<float>_>::at
                              ((vector<float,_std::allocator<float>_> *)&i,0);
    }
    image._16_8_ = &stack0xfffffffffffffbc8;
    image.images._0_4_ = components_local;
    image.images._4_4_ = save_as_fp16_local;
    header.pixel_types._0_4_ = outbuf_local._4_4_;
    header.custom_attributes = (EXRAttribute *)malloc((long)outbuf_local._4_4_ * 0x110);
    if (outbuf_local._4_4_ == 4) {
      strncpy((char *)header.custom_attributes,"A",0xff);
      strncpy((header.custom_attributes)->type + 0x10,"B",0xff);
      strncpy(header.custom_attributes[1].name + 0x10,"G",0xff);
      strncpy(header.custom_attributes[1].type + 0x20,"R",0xff);
      (header.custom_attributes)->name[1] = '\0';
      (header.custom_attributes)->type[0x11] = '\0';
      header.custom_attributes[1].name[0x11] = '\0';
      header.custom_attributes[1].type[0x21] = '\0';
    }
    else if (outbuf_local._4_4_ == 3) {
      strncpy((char *)header.custom_attributes,"B",0xff);
      strncpy((header.custom_attributes)->type + 0x10,"G",0xff);
      strncpy(header.custom_attributes[1].name + 0x10,"R",0xff);
      (header.custom_attributes)->name[1] = '\0';
      (header.custom_attributes)->type[0x11] = '\0';
      header.custom_attributes[1].name[0x11] = '\0';
    }
    else {
      strncpy((char *)header.custom_attributes,"A",0xff);
      (header.custom_attributes)->name[1] = '\0';
    }
    header.channels = (EXRChannelInfo *)malloc((long)(int)header.pixel_types << 2);
    header._120_8_ = malloc((long)(int)header.pixel_types << 2);
    for (mem_buf._4_4_ = 0; mem_buf._4_4_ < (int)header.pixel_types;
        mem_buf._4_4_ = mem_buf._4_4_ + 1) {
      pcVar1 = (header.channels)->name + (long)mem_buf._4_4_ * 4;
      pcVar1[0] = '\x02';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      if ((int)outbuf_local < 1) {
        *(undefined4 *)(header._120_8_ + (long)mem_buf._4_4_ * 4) = 2;
      }
      else {
        *(undefined4 *)(header._120_8_ + (long)mem_buf._4_4_ * 4) = 1;
      }
    }
    sVar6 = SaveEXRImageToMemory
                      ((EXRImage *)local_3a0,(EXRHeader *)&image.num_channels,(uchar **)&mem_size,
                       err);
    if (sVar6 == 0) {
      data_local._4_4_ = -0xc;
    }
    else {
      free(header.custom_attributes);
      free(header.channels);
      free((void *)header._120_8_);
      iVar3 = std::numeric_limits<int>::max();
      if ((ulong)(long)iVar3 < sVar6) {
        free((void *)mem_size);
        data_local._4_4_ = -0xe;
      }
      else {
        *local_30 = (uchar *)mem_size;
        data_local._4_4_ = (int)sVar6;
      }
    }
    local_508 = &images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    do {
      local_508 = local_508 + -3;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_508);
    } while (local_508 != (pointer *)&i);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar4 = std::operator<<(local_1a8,"Unsupported component value : ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,outbuf_local._4_4_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    tinyexr::SetErrorMessage((string *)(header.name + 0xf8),err);
    std::__cxx11::string::~string((string *)(header.name + 0xf8));
    data_local._4_4_ = -3;
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return data_local._4_4_;
}

Assistant:

int SaveEXRToMemory(const float *data, int width, int height, int components,
            const int save_as_fp16, unsigned char **outbuf, const char **err) {

  if ((components == 1) || components == 3 || components == 4) {
    // OK
  } else {
    std::stringstream ss;
    ss << "Unsupported component value : " << components << std::endl;

    tinyexr::SetErrorMessage(ss.str(), err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRHeader header;
  InitEXRHeader(&header);

  if ((width < 16) && (height < 16)) {
    // No compression for small image.
    header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;
  } else {
    header.compression_type = TINYEXR_COMPRESSIONTYPE_ZIP;
  }

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = components;

  std::vector<float> images[4];

  if (components == 1) {
    images[0].resize(static_cast<size_t>(width * height));
    memcpy(images[0].data(), data, sizeof(float) * size_t(width * height));
  } else {
    images[0].resize(static_cast<size_t>(width * height));
    images[1].resize(static_cast<size_t>(width * height));
    images[2].resize(static_cast<size_t>(width * height));
    images[3].resize(static_cast<size_t>(width * height));

    // Split RGB(A)RGB(A)RGB(A)... into R, G and B(and A) layers
    if (components == 4) {
        for (size_t i = 0; i < static_cast<size_t>(width * height); i++) {
          images[0][i] = data[static_cast<size_t>(components) * i + 0];
          images[1][i] = data[static_cast<size_t>(components) * i + 1];
          images[2][i] = data[static_cast<size_t>(components) * i + 2];
          images[3][i] = data[static_cast<size_t>(components) * i + 3];
        }
    } else {
       for (size_t i = 0; i < static_cast<size_t>(width * height); i++) {
          images[0][i] = data[static_cast<size_t>(components) * i + 0];
          images[1][i] = data[static_cast<size_t>(components) * i + 1];
          images[2][i] = data[static_cast<size_t>(components) * i + 2];
        }
    }
  }

  float *image_ptr[4] = {0, 0, 0, 0};
  if (components == 4) {
    image_ptr[0] = &(images[3].at(0));  // A
    image_ptr[1] = &(images[2].at(0));  // B
    image_ptr[2] = &(images[1].at(0));  // G
    image_ptr[3] = &(images[0].at(0));  // R
  } else if (components == 3) {
    image_ptr[0] = &(images[2].at(0));  // B
    image_ptr[1] = &(images[1].at(0));  // G
    image_ptr[2] = &(images[0].at(0));  // R
  } else if (components == 1) {
    image_ptr[0] = &(images[0].at(0));  // A
  }

  image.images = reinterpret_cast<unsigned char **>(image_ptr);
  image.width = width;
  image.height = height;

  header.num_channels = components;
  header.channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(header.num_channels)));
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  if (components == 4) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
    strncpy_s(header.channels[1].name, "B", 255);
    strncpy_s(header.channels[2].name, "G", 255);
    strncpy_s(header.channels[3].name, "R", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
    strncpy(header.channels[1].name, "B", 255);
    strncpy(header.channels[2].name, "G", 255);
    strncpy(header.channels[3].name, "R", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
    header.channels[1].name[strlen("B")] = '\0';
    header.channels[2].name[strlen("G")] = '\0';
    header.channels[3].name[strlen("R")] = '\0';
  } else if (components == 3) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "B", 255);
    strncpy_s(header.channels[1].name, "G", 255);
    strncpy_s(header.channels[2].name, "R", 255);
#else
    strncpy(header.channels[0].name, "B", 255);
    strncpy(header.channels[1].name, "G", 255);
    strncpy(header.channels[2].name, "R", 255);
#endif
    header.channels[0].name[strlen("B")] = '\0';
    header.channels[1].name[strlen("G")] = '\0';
    header.channels[2].name[strlen("R")] = '\0';
  } else {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
  }

  header.pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  header.requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] =
        TINYEXR_PIXELTYPE_FLOAT;  // pixel type of input image

    if (save_as_fp16 > 0) {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_HALF;  // save with half(fp16) pixel format
    } else {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_FLOAT;  // save with float(fp32) pixel format(i.e.
                                    // no precision reduction)
    }
  }


  unsigned char *mem_buf;
  size_t mem_size = SaveEXRImageToMemory(&image, &header, &mem_buf, err);

  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALIZATION_FAILED;
  }

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  if (mem_size > size_t(std::numeric_limits<int>::max())) {
    free(mem_buf);
    return TINYEXR_ERROR_DATA_TOO_LARGE;
  }

  (*outbuf) = mem_buf;

  return int(mem_size);
}